

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int plan2duu(PlannerType plannerType,char *envCfgFilename)

{
  char cVar1;
  int iVar2;
  int iVar3;
  runtime_error *prVar4;
  float ProbofReachGoal;
  float ExpectedCost;
  MDPConfig MDPCfg;
  PPCPPlanner planner;
  vector<POLICYBELIEFSTATEWITHBINARYHVALS,_std::allocator<POLICYBELIEFSTATEWITHBINARYHVALS>_>
  SolutionPolicy;
  EnvironmentNAV2DUU environment_nav2Duu;
  float local_238;
  float local_234 [3];
  PPCPPlanner local_228 [32];
  vector<POLICYBELIEFSTATEWITHBINARYHVALS,_std::allocator<POLICYBELIEFSTATEWITHBINARYHVALS>_>
  local_208;
  DiscreteSpaceInformation local_1f0 [12];
  
  EnvironmentNAV2DUU::EnvironmentNAV2DUU((EnvironmentNAV2DUU *)local_1f0);
  cVar1 = EnvironmentNAV2DUU::InitializeEnv((char *)local_1f0);
  if (cVar1 == '\0') {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar4,"ERROR: InitializeEnv failed");
  }
  else {
    cVar1 = EnvironmentNAV2DUU::InitializeMDPCfg((MDPConfig *)local_1f0);
    if (cVar1 != '\0') {
      iVar2 = EnvironmentNAV2DUU::SizeofCreatedEnv();
      iVar3 = EnvironmentNAV2DUU::SizeofH();
      PPCPPlanner::PPCPPlanner(local_228,local_1f0,iVar2,iVar3);
      iVar2 = PPCPPlanner::set_start((int)local_228);
      if (iVar2 == 0) {
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar4,"ERROR: failed to set start state");
      }
      else {
        iVar2 = PPCPPlanner::set_goal((int)local_228);
        if (iVar2 != 0) {
          puts("start planning...");
          local_208.
          super__Vector_base<POLICYBELIEFSTATEWITHBINARYHVALS,_std::allocator<POLICYBELIEFSTATEWITHBINARYHVALS>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_208.
          super__Vector_base<POLICYBELIEFSTATEWITHBINARYHVALS,_std::allocator<POLICYBELIEFSTATEWITHBINARYHVALS>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_208.
          super__Vector_base<POLICYBELIEFSTATEWITHBINARYHVALS,_std::allocator<POLICYBELIEFSTATEWITHBINARYHVALS>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          iVar2 = PPCPPlanner::replan(10.0,(vector *)local_228,(float *)&local_208,local_234);
          puts("done planning");
          if (iVar2 == 0) {
            puts("Solution does not exist");
          }
          else {
            printf("Solution is found: exp. cost=%f probofreachgoal=%f\n",
                   SUB84((double)local_234[0],0),(double)local_238);
          }
          fflush((FILE *)0x0);
          std::
          vector<POLICYBELIEFSTATEWITHBINARYHVALS,_std::allocator<POLICYBELIEFSTATEWITHBINARYHVALS>_>
          ::~vector(&local_208);
          PPCPPlanner::~PPCPPlanner(local_228);
          DiscreteSpaceInformation::~DiscreteSpaceInformation(local_1f0);
          return iVar2;
        }
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar4,"ERROR: failed to set goal state");
      }
      *(undefined ***)prVar4 = &PTR__runtime_error_0010ec48;
      __cxa_throw(prVar4,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
    }
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar4,"ERROR: InitializeMDPCfg failed");
  }
  *(undefined ***)prVar4 = &PTR__runtime_error_0010ec48;
  __cxa_throw(prVar4,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int plan2duu(PlannerType plannerType, char* envCfgFilename)
{
    int bRet = 0;
    double allocated_time_secs = 10.0; //in seconds
    MDPConfig MDPCfg;

    //Initialize Environment (should be called before initializing anything else)
    EnvironmentNAV2DUU environment_nav2Duu;
    if (!environment_nav2Duu.InitializeEnv(envCfgFilename)) {
        throw SBPL_Exception("ERROR: InitializeEnv failed");
    }

    //Initialize MDP Info
    if (!environment_nav2Duu.InitializeMDPCfg(&MDPCfg)) {
        throw SBPL_Exception("ERROR: InitializeMDPCfg failed");
    }

    //create the planner
    PPCPPlanner planner(&environment_nav2Duu, environment_nav2Duu.SizeofCreatedEnv(), environment_nav2Duu.SizeofH());

    //set start and goal
    if (planner.set_start(MDPCfg.startstateid) == 0) {
        throw SBPL_Exception("ERROR: failed to set start state");
    }
    if (planner.set_goal(MDPCfg.goalstateid) == 0) {
        throw SBPL_Exception("ERROR: failed to set goal state");
    }

    printf("start planning...\n");
    float ExpectedCost, ProbofReachGoal;
    vector<sbpl_PolicyStatewithBinaryh_t> SolutionPolicy;
    bRet = planner.replan(allocated_time_secs, &SolutionPolicy, &ExpectedCost, &ProbofReachGoal);
    printf("done planning\n");

    if (bRet) {
        //print the solution
        printf("Solution is found: exp. cost=%f probofreachgoal=%f\n", ExpectedCost, ProbofReachGoal);
    }
    else {
        printf("Solution does not exist\n");
    }

    fflush(NULL);

    return bRet;
}